

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetFenceTypeString(FENCE_TYPE Type)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  FENCE_TYPE Type_local;
  
  if (Type == FENCE_TYPE_CPU_WAIT_ONLY) {
    pcStack_10 = "CPU_WAIT_ONLY";
  }
  else if (Type == FENCE_TYPE_GENERAL) {
    pcStack_10 = "GENERAL";
  }
  else {
    msg.field_2._M_local_buf[0xf] = Type;
    FormatString<char[22]>((string *)local_38,(char (*) [22])"Unexpected fence type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetFenceTypeString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x9de);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

const Char* GetFenceTypeString(FENCE_TYPE Type)
{
    static_assert(FENCE_TYPE_LAST == 1, "Please update the switch below to handle the new fence type");
    switch (Type)
    {
        // clang-format off
        case FENCE_TYPE_CPU_WAIT_ONLY: return "CPU_WAIT_ONLY";
        case FENCE_TYPE_GENERAL:       return "GENERAL";
        // clang-format on
        default:
            UNEXPECTED("Unexpected fence type");
            return "Unknown";
    }
}